

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::split_up
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str,char delimiter)

{
  char cVar1;
  pointer pcVar2;
  char *pcVar3;
  void *pvVar4;
  size_t __n;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  size_t sVar9;
  size_type __size;
  size_type sVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *output;
  string value;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it_1;
  value_type local_a0;
  uint local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_dataplus._M_p = (str->_M_dataplus)._M_p;
  local_a0._M_dataplus._M_p = local_50._M_dataplus._M_p + str->_M_string_length;
  ::std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
            (&local_78);
  str->_M_string_length = (long)local_78._M_dataplus._M_p - (long)(str->_M_dataplus)._M_p;
  *local_78._M_dataplus._M_p = '\0';
  _Var5 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                    ();
  pcVar2 = (str->_M_dataplus)._M_p;
  if (pcVar2 + str->_M_string_length == _Var5._M_current) {
    str->_M_string_length = 0;
    *pcVar2 = '\0';
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_erase
              (str,0,(long)_Var5._M_current - (long)pcVar2);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar10 = str->_M_string_length;
  if (sVar10 != 0) {
    local_7c = (uint)(byte)delimiter;
    do {
      __n = DAT_004f63b8;
      pvVar7 = bracketChars_abi_cxx11_;
      pcVar3 = (str->_M_dataplus)._M_p;
      if (DAT_004f63b8 == 0) {
LAB_001ac5fc:
        _Var5 = ::std::
                __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::split_up(std::__cxx11::string,char)::_lambda(char)_1_>>
                          (pcVar3,pcVar3 + sVar10,local_7c);
        pcVar2 = (str->_M_dataplus)._M_p;
        if (_Var5._M_current == pcVar2 + str->_M_string_length) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,str);
          str->_M_string_length = 0;
          *(str->_M_dataplus)._M_p = '\0';
        }
        else {
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          ::std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((string *)&local_a0,pcVar2,_Var5._M_current);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&local_a0);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          ::std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((string *)&local_78,_Var5._M_current + 1,
                     (str->_M_dataplus)._M_p + str->_M_string_length);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (str,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        cVar1 = *pcVar3;
        pvVar6 = memchr(bracketChars_abi_cxx11_,(int)cVar1,DAT_004f63b8);
        pvVar4 = bracketChars_abi_cxx11_;
        if ((long)pvVar6 - (long)pvVar7 == -1 || pvVar6 == (void *)0x0) goto LAB_001ac5fc;
        if (__n == 0) {
          uVar8 = 0xffffffffffffffff;
        }
        else {
          pvVar7 = memchr(bracketChars_abi_cxx11_,(int)cVar1,__n);
          uVar8 = -(ulong)(pvVar7 == (void *)0x0) | (long)pvVar7 - (long)pvVar4;
        }
        sVar9 = close_sequence(str,0,*(char *)(matchBracketChars_abi_cxx11_ + uVar8));
        if (sVar9 < str->_M_string_length) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_a0,str,0,sVar9 + 1);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if (str->_M_string_length <= sVar9 + 2) goto LAB_001ac72c;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_50,str,sVar9 + 2,0xffffffffffffffff);
          split_up();
        }
        else {
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,str);
LAB_001ac72c:
          str->_M_string_length = 0;
          *(str->_M_dataplus)._M_p = '\0';
        }
      }
      local_78._M_dataplus._M_p = (str->_M_dataplus)._M_p;
      local_a0._M_dataplus._M_p = local_78._M_dataplus._M_p + str->_M_string_length;
      ::std::
      __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                (&local_58,&local_a0,&local_78);
      str->_M_string_length = (long)local_58 - (long)(str->_M_dataplus)._M_p;
      *local_58 = 0;
      _Var5 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                        ();
      pcVar2 = (str->_M_dataplus)._M_p;
      if (pcVar2 + str->_M_string_length == _Var5._M_current) {
        str->_M_string_length = 0;
        *pcVar2 = '\0';
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_erase
                  (str,0,(long)_Var5._M_current - (long)pcVar2);
      }
      sVar10 = str->_M_string_length;
    } while (sVar10 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::vector<std::string> split_up(std::string str, char delimiter) {

    auto find_ws = [delimiter](char ch) {
        return (delimiter == '\0') ? std::isspace<char>(ch, std::locale()) : (ch == delimiter);
    };
    trim(str);

    std::vector<std::string> output;
    while(!str.empty()) {
        if(bracketChars.find_first_of(str[0]) != std::string::npos) {
            auto bracketLoc = bracketChars.find_first_of(str[0]);
            auto end = close_sequence(str, 0, matchBracketChars[bracketLoc]);
            if(end >= str.size()) {
                output.push_back(std::move(str));
                str.clear();
            } else {
                output.push_back(str.substr(0, end + 1));
                if(end + 2 < str.size()) {
                    str = str.substr(end + 2);
                } else {
                    str.clear();
                }
            }

        } else {
            auto it = std::find_if(std::begin(str), std::end(str), find_ws);
            if(it != std::end(str)) {
                std::string value = std::string(str.begin(), it);
                output.push_back(value);
                str = std::string(it + 1, str.end());
            } else {
                output.push_back(str);
                str.clear();
            }
        }
        trim(str);
    }
    return output;
}